

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_trace_scan.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_trace_scan
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  parasail_result_t *ppVar4;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  ulong uVar5;
  byte *pbVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  int a;
  int iVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  byte *pbVar15;
  uint uVar16;
  size_t size;
  ulong size_00;
  int *__s;
  int local_94;
  ulong local_78;
  int *local_68;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_trace_scan_cold_7();
  }
  else {
    local_78 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sg_flags_trace_scan_cold_6();
    }
    else if (open < 0) {
      parasail_sg_flags_trace_scan_cold_5();
    }
    else if (gap < 0) {
      parasail_sg_flags_trace_scan_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sg_flags_trace_scan_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sg_flags_trace_scan_cold_2();
          return (parasail_result_t *)0x0;
        }
        uVar13 = (ulong)(uint)_s1Len;
        if (_s1Len < 1) {
          parasail_sg_flags_trace_scan_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar13 = (ulong)(uint)matrix->length;
      }
      a = (int)uVar13;
      ppVar4 = parasail_result_new_trace(a,s2Len,0x10,1);
      if (ppVar4 != (parasail_result_t *)0x0) {
        ppVar4->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                       (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar4->flag |
                       0x1480202;
        size_00 = (ulong)(uint)s2Len;
        ptr = parasail_memalign_int(0x10,size_00);
        ptr_00 = parasail_memalign_int(0x10,(long)(a + 1));
        size = (size_t)a;
        ptr_01 = parasail_memalign_int(0x10,size);
        ptr_02 = parasail_memalign_int(0x10,(long)(a + 1));
        ptr_03 = parasail_memalign_int(0x10,size);
        if (ptr == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        if (ptr_00 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        if (ptr_01 == (int *)0x0) {
          return (parasail_result_t *)0x0;
        }
        if (ptr_02 != (int *)0x0) {
          if (ptr_03 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          pbVar15 = (byte *)((ppVar4->field_4).rowcols)->score_row;
          if (matrix->type == 0) {
            local_68 = parasail_memalign_int(0x10,size);
            if (local_68 == (int *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < a) {
              piVar1 = matrix->mapper;
              uVar5 = 0;
              do {
                local_68[uVar5] = piVar1[(byte)_s1[uVar5]];
                uVar5 = uVar5 + 1;
              } while (uVar13 != uVar5);
            }
          }
          else {
            local_68 = (int *)0x0;
          }
          __s = ptr_00 + 1;
          piVar1 = matrix->mapper;
          uVar5 = 1;
          if (1 < s2Len) {
            uVar5 = local_78;
          }
          uVar7 = 0;
          do {
            ptr[uVar7] = piVar1[(byte)_s2[uVar7]];
            uVar7 = uVar7 + 1;
          } while (uVar5 != uVar7);
          *ptr_00 = 0;
          *ptr_02 = 0;
          if (s1_beg == 0) {
            if (0 < a) {
              iVar2 = -open;
              uVar5 = 0;
              do {
                __s[uVar5] = iVar2;
                uVar5 = uVar5 + 1;
                iVar2 = iVar2 - gap;
              } while (uVar13 != uVar5);
            }
          }
          else if (0 < a) {
            memset(__s,0,uVar13 * 4);
          }
          if (0 < a) {
            uVar5 = 0;
            do {
              ptr_01[uVar5] = -0x40000000;
              uVar5 = uVar5 + 1;
            } while (uVar13 != uVar5);
          }
          uVar3 = s2Len - 1;
          iVar2 = -0x40000000;
          local_94 = a;
          if (s2Len != 1) {
            uVar5 = 1;
            if (1 < (int)uVar3) {
              uVar5 = (ulong)uVar3;
            }
            iVar2 = -0x40000000;
            uVar7 = 0;
            pbVar9 = pbVar15;
            do {
              if (0 < a) {
                uVar8 = 0;
                pbVar6 = pbVar9;
                do {
                  iVar10 = __s[uVar8] - open;
                  iVar12 = ptr_01[uVar8] - gap;
                  iVar11 = iVar12;
                  if (iVar12 <= iVar10) {
                    iVar11 = iVar10;
                  }
                  ptr_01[uVar8] = iVar11;
                  *pbVar6 = (iVar10 <= iVar12) * '\b' + 8;
                  uVar8 = uVar8 + 1;
                  pbVar6 = pbVar6 + size_00;
                } while (uVar13 != uVar8);
              }
              iVar11 = -((int)uVar7 * gap + open);
              if (s2_beg != 0) {
                iVar11 = 0;
              }
              *ptr_02 = iVar11;
              if (0 < a) {
                piVar1 = matrix->matrix;
                uVar8 = 0;
                do {
                  if (matrix->type == 0) {
                    iVar10 = local_68[uVar8] * matrix->size;
                  }
                  else {
                    iVar10 = matrix->size * (int)uVar8;
                  }
                  iVar12 = ptr_00[uVar8] + piVar1[(long)iVar10 + (long)ptr[uVar7]];
                  iVar10 = ptr_01[uVar8];
                  if (ptr_01[uVar8] < iVar12) {
                    iVar10 = iVar12;
                  }
                  ptr_02[uVar8 + 1] = iVar10;
                  ptr_03[uVar8] = (uint)(iVar12 < ptr_01[uVar8]);
                  uVar8 = uVar8 + 1;
                } while (uVar13 != uVar8);
              }
              if (0 < a) {
                iVar10 = -0x40000000;
                uVar8 = 0;
                pbVar6 = pbVar9;
                do {
                  iVar12 = iVar10 - gap;
                  iVar10 = ptr_02[uVar8];
                  if (ptr_02[uVar8] <= iVar12) {
                    iVar10 = iVar12;
                  }
                  iVar14 = iVar10 - open;
                  *pbVar6 = *pbVar6 | (ptr_00[uVar8] <= iVar12) * ' ' + 0x20U;
                  if (iVar14 < ptr_02[uVar8 + 1]) {
                    __s[uVar8] = ptr_02[uVar8 + 1];
                    *pbVar6 = *pbVar6 | (ptr_03[uVar8] == 0) * '\x03' + 1U;
                  }
                  else {
                    __s[uVar8] = iVar14;
                    if ((ptr_02[uVar8 + 1] == iVar14) && (ptr_03[uVar8] == 0)) {
                      *pbVar6 = *pbVar6 | 4;
                    }
                    else {
                      *pbVar6 = *pbVar6 | 2;
                    }
                  }
                  uVar8 = uVar8 + 1;
                  pbVar6 = pbVar6 + size_00;
                } while (uVar13 != uVar8);
              }
              *ptr_00 = iVar11;
              if ((s2_end != 0) && (iVar2 < __s[a + -1])) {
                local_78 = uVar7 & 0xffffffff;
                iVar2 = __s[a + -1];
                local_94 = a + -1;
              }
              uVar7 = uVar7 + 1;
              pbVar9 = pbVar9 + 1;
            } while (uVar7 != uVar5);
          }
          if (0 < a) {
            pbVar9 = pbVar15 + uVar3;
            uVar5 = 0;
            do {
              iVar10 = __s[uVar5] - open;
              iVar12 = ptr_01[uVar5] - gap;
              iVar11 = iVar12;
              if (iVar12 <= iVar10) {
                iVar11 = iVar10;
              }
              ptr_01[uVar5] = iVar11;
              *pbVar9 = (iVar10 <= iVar12) * '\b' + 8;
              uVar5 = uVar5 + 1;
              pbVar9 = pbVar9 + size_00;
            } while (uVar13 != uVar5);
          }
          iVar11 = 0;
          if (s2_beg == 0) {
            iVar11 = -(uVar3 * gap + open);
          }
          *ptr_02 = iVar11;
          uVar16 = (uint)local_78;
          if (0 < a) {
            piVar1 = matrix->matrix;
            uVar5 = 0;
            do {
              if (matrix->type == 0) {
                iVar11 = local_68[uVar5] * matrix->size;
              }
              else {
                iVar11 = matrix->size * (int)uVar5;
              }
              iVar10 = ptr_00[uVar5] + piVar1[(long)iVar11 + (long)ptr[uVar3]];
              iVar11 = ptr_01[uVar5];
              if (ptr_01[uVar5] < iVar10) {
                iVar11 = iVar10;
              }
              ptr_02[uVar5 + 1] = iVar11;
              ptr_03[uVar5] = (uint)(iVar10 < ptr_01[uVar5]);
              uVar5 = uVar5 + 1;
            } while (uVar13 != uVar5);
          }
          if (0 < a) {
            pbVar15 = pbVar15 + uVar3;
            iVar11 = -0x40000000;
            uVar5 = 0;
            do {
              iVar10 = iVar11 - gap;
              iVar11 = ptr_02[uVar5];
              if (ptr_02[uVar5] <= iVar10) {
                iVar11 = iVar10;
              }
              iVar12 = iVar11 - open;
              *pbVar15 = *pbVar15 | (ptr_00[uVar5] <= iVar10) * ' ' + 0x20U;
              if (iVar12 < ptr_02[uVar5 + 1]) {
                __s[uVar5] = ptr_02[uVar5 + 1];
                *pbVar15 = *pbVar15 | (ptr_03[uVar5] == 0) * '\x03' + 1U;
              }
              else {
                __s[uVar5] = iVar12;
                if ((ptr_02[uVar5 + 1] == iVar12) && (ptr_03[uVar5] == 0)) {
                  *pbVar15 = *pbVar15 | 4;
                }
                else {
                  *pbVar15 = *pbVar15 | 2;
                }
              }
              if ((s1_end != 0) && (iVar2 < __s[uVar5])) {
                local_94 = (int)uVar5;
                local_78 = (ulong)uVar3;
                iVar2 = __s[uVar5];
              }
              uVar16 = (uint)local_78;
              uVar5 = uVar5 + 1;
              pbVar15 = pbVar15 + size_00;
            } while (uVar13 != uVar5);
          }
          if ((s2_end != 0) && (iVar2 < ptr_00[size])) {
            local_94 = a + -1;
            iVar2 = ptr_00[size];
            uVar16 = uVar3;
          }
          if (s2_end == 0 && s1_end == 0) {
            local_94 = a + -1;
            iVar2 = ptr_00[size];
            uVar16 = uVar3;
          }
          ppVar4->score = iVar2;
          ppVar4->end_query = local_94;
          ppVar4->end_ref = uVar16;
          parasail_free(ptr_03);
          parasail_free(ptr_02);
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_68);
            return ppVar4;
          }
          return ppVar4;
        }
        return (parasail_result_t *)0x0;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict HB = NULL;
    int * restrict H = NULL;
    int * restrict E = NULL;
    int * restrict HtB = NULL;
    int * restrict Ht = NULL;
    int8_t * restrict HT = NULL;
    int * restrict Ex = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC_SCAN
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    HB = parasail_memalign_int(16, s1Len+1);
    H  = HB+1;
    E  = parasail_memalign_int(16, s1Len);
    HtB= parasail_memalign_int(16, s1Len+1);
    Ht = HtB+1;
    Ex = parasail_memalign_int(16, s1Len);
    HT = (int8_t* restrict)result->trace->trace_table;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!HB) return NULL;
    if (!E) return NULL;
    if (!HtB) return NULL;
    if (!Ex) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* initialize H */
    H[-1] = 0;
    Ht[-1] = 0;
    if (s1_beg) {
        for (i=0; i<s1Len; ++i) {
            H[i] = 0;
        }
    }
    else {
        for (i=0; i<s1Len; ++i) {
            H[i] = -open -i*gap;
        }
    }

    /* initialize E */
    for (i=0; i<s1Len; ++i) {
        E[i] = NEG_INF_32;
    }

    /* iterate over database */
    for (j=0; j<s2Len-1; ++j) {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            E[i] = MAX(E_ext, E_opn);
            HT[1LL*i*s2Len + j] = (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                  : PARASAIL_INS_E;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ht[i] = MAX(H_dag, E[i]);
            Ex[i] = (E[i] > H_dag);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                HT[1LL*i*s2Len + j] |= PARASAIL_DIAG_F;
            }
            else {
                HT[1LL*i*s2Len + j] |= PARASAIL_DEL_F;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HT[1LL*i*s2Len + j] |= Ex[i] ? PARASAIL_INS : PARASAIL_DIAG;
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                    }
                    else {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DIAG;
                    }
                }
                else {
                    HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                }
            }
        }
        H[-1] = s2_beg ? 0 : (-open - j*gap);
        if (s2_end && H[s1Len-1] > score) {
            score = H[s1Len-1];
            end_query = s1Len-1;
            end_ref = j;
        }
    }
    j = s2Len - 1;
    {
        int Ft = NEG_INF_32;
        /* calculate E */
        for (i=0; i<s1Len; ++i) {
            int E_opn = H[i]-open;
            int E_ext = E[i]-gap;
            E[i] = MAX(E_ext, E_opn);
            HT[1LL*i*s2Len + j] = (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                  : PARASAIL_INS_E;
        }
        /* calculate Ht */
        Ht[-1] = s2_beg ? 0 : (-open -j*gap);
        for (i=0; i<s1Len; ++i) {
            int matval = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
                         matrix->matrix[matrix->size*s1[i]+s2[j]] :
                         matrix->matrix[matrix->size*i+s2[j]];
            int H_dag = H[i-1]+matval;
            Ht[i] = MAX(H_dag, E[i]);
            Ex[i] = (E[i] > H_dag);
        }
        /* calculate H */
        for (i=0; i<s1Len; ++i) {
            int Ft_opn;
            int Ht_pre = Ht[i-1];
            int Ft_ext = Ft-gap;
            if (Ht_pre >= Ft_ext) {
                Ft = Ht_pre;
            }
            else {
                Ft = Ft_ext;
            }
            Ft_opn = Ft-open;
            if (H[i-1] > Ft_ext) {
                HT[1LL*i*s2Len + j] |= PARASAIL_DIAG_F;
            }
            else {
                HT[1LL*i*s2Len + j] |= PARASAIL_DEL_F;
            }
            if (Ht[i] > Ft_opn) {
                H[i] = Ht[i];
                HT[1LL*i*s2Len + j] |= Ex[i] ? PARASAIL_INS : PARASAIL_DIAG;
            }
            else {
                H[i] = Ft_opn;
                if (Ht[i] == Ft_opn) {
                    if (Ex[i]) {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                    }
                    else {
                        HT[1LL*i*s2Len + j] |= PARASAIL_DIAG;
                    }
                }
                else {
                    HT[1LL*i*s2Len + j] |= PARASAIL_DEL;
                }
            }
            if (s1_end && H[i] > score) {
                score = H[i];
                end_query = i;
                end_ref = j;
            }
        }
    }
    if (s2_end && H[s1Len-1] > score) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }
    if (!s1_end && !s2_end) {
        score = H[s1Len-1];
        end_query = s1Len-1;
        end_ref = s2Len-1;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(Ex);
    parasail_free(HtB);
    parasail_free(E);
    parasail_free(HB);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}